

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O1

Timer * __thiscall sznet::MinHeap<sznet::Timer>::pop(MinHeap<sznet::Timer> *this)

{
  uint uVar1;
  Timer *pTVar2;
  
  if (this->m_size == 0) {
    pTVar2 = (Timer *)0x0;
  }
  else {
    pTVar2 = *this->m_ptrArr;
    uVar1 = this->m_size - 1;
    this->m_size = uVar1;
    shiftDown_(this,0,this->m_ptrArr[uVar1]);
    (pTVar2->super_MinHeaBaseElem).min_heap_idx = -1;
  }
  return pTVar2;
}

Assistant:

T* pop()
	{
		if (m_size)
		{
			T* e = m_ptrArr[0];
			shiftDown_(0, m_ptrArr[--m_size]);
			e->min_heap_idx = -1;

			return e;
		}

		return nullptr;
	}